

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O2

void Marshall_object_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  anon_union_8_8_ea4c8939_for_value aVar4;
  Am_Value *pAVar5;
  Am_Object *the_obj;
  Am_Object in_obj;
  Am_String proto_name;
  Am_Value_List slot_list;
  Am_Value local_50;
  Am_Value local_40;
  Am_Value local_30;
  
  Am_Object::Am_Object(&in_obj,in_value);
  pcVar3 = Am_Connection::Get_Net_Proto_Name(&in_obj);
  Am_String::Am_String(&proto_name,pcVar3,true);
  Am_Value::Am_Value(&local_50,&proto_name);
  Am_Connection::Send(my_connection_ptr,&local_50);
  Am_Value::~Am_Value(&local_50);
  the_obj = &in_obj;
  pcVar3 = Am_Connection::Get_Net_Object_ID(the_obj);
  if (pcVar3 == (char *)0x0) {
    iVar2 = Am_Connection::Num_Instances();
    pcVar3 = Am_String::operator_cast_to_char_(&proto_name);
    aVar4._0_4_ = iVar2 + 1;
    aVar4.long_value._4_4_ = 0;
    Am_Connection::Set_Net_Instance(&in_obj,pcVar3,aVar4._0_4_);
  }
  else {
    aVar4.long_value = Am_Connection::Extract_Instance_Num((Am_Connection *)the_obj,pcVar3);
  }
  local_40.type = 3;
  local_40.value = aVar4;
  Am_Connection::Send(my_connection_ptr,&local_40);
  Am_Value::~Am_Value(&local_40);
  pAVar5 = Am_Object::Get(&in_obj,0xb8,0);
  Am_Value_List::Am_Value_List(&slot_list,pAVar5);
  Am_Value_List::Start(&slot_list);
  while( true ) {
    bVar1 = Am_Value_List::Last(&slot_list);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get(&slot_list);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&in_obj,(Am_Slot_Key)iVar2,0);
    Am_Value::Am_Value(&local_30,pAVar5);
    Am_Connection::Send(my_connection_ptr,&local_30);
    Am_Value::~Am_Value(&local_30);
    Am_Value_List::Next(&slot_list);
  }
  Am_Value_List::~Am_Value_List(&slot_list);
  Am_String::~Am_String(&proto_name);
  Am_Object::~Am_Object(&in_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_object,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)the_socket; // avoid warning
  Am_Object in_obj = in_value;
  Am_String proto_name = Am_Connection::Get_Net_Proto_Name(in_obj);
  //
  my_connection_ptr->Send(proto_name);

  //
  const char *in_obj_id = Am_Connection::Get_Net_Object_ID(in_obj);
  //
  long instance_num;
  if (in_obj_id == nullptr) // No ID assigned yet
  {
    //
    instance_num = Am_Connection::Num_Instances() + 1;
    Am_Connection::Set_Net_Instance(in_obj, proto_name, instance_num);
  } else {
    instance_num = my_connection_ptr->Extract_Instance_Num(in_obj_id);
  }
  my_connection_ptr->Send(instance_num);
  //  recv(the_socket, &net_type,sizeof(net_type),0);
  //  bool ok=Unmarshall_bool.Call(the_socket,my_connection_ptr);
  if (true) {
    Am_Value_List slot_list = in_obj.Get(Am_SLOTS_TO_SAVE);
    Am_Slot_Key current_slot;
    for (
        slot_list.Start(); !(slot_list.Last());
        slot_list
            .Next()) { /*Note: slot keys are shorts, value is char 256 will overflow!*/
      current_slot = (int)slot_list.Get();
      my_connection_ptr->Send(in_obj.Get(current_slot));
    }
  } else // Not ok
    std::cerr << " Error when sending object: " << in_obj << "!\n";
}